

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

reentrant_put_transaction<void> *
density_tests::detail::
TryPutFloat<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *queue,EasyRandom *i_rand)

{
  progress_guarantee i_progress_guarantee;
  int iVar1;
  float source;
  runtime_type local_48;
  reentrant_put_transaction<float> local_40;
  
  source = 3.1415;
  i_progress_guarantee = get_rand_progress_guarantee(i_rand);
  iVar1 = EasyRandom::get_int<int>(i_rand,3);
  switch(iVar1) {
  case 1:
    density::
    sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
    ::try_start_reentrant_emplace<float,float&>
              (&local_40,
               (sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                *)queue,i_progress_guarantee,&source);
    break;
  case 2:
    local_48.m_feature_table =
         (tuple_type *)
         density::detail::
         FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,float>
         ::s_table;
    density::
    sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::try_start_reentrant_dyn_push_copy
              ((reentrant_put_transaction<void> *)&local_40,
               (sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                *)queue,i_progress_guarantee,&local_48,&source);
    goto LAB_0115d651;
  case 3:
    local_48.m_feature_table =
         (tuple_type *)
         density::detail::
         FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,float>
         ::s_table;
    density::
    sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::try_start_reentrant_dyn_push_move
              ((reentrant_put_transaction<void> *)&local_40,
               (sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                *)queue,i_progress_guarantee,&local_48,&source);
LAB_0115d651:
    (__return_storage_ptr__->m_put).m_user_storage = local_40.m_put.m_user_storage;
    (__return_storage_ptr__->m_put).m_control_block = local_40.m_put.m_control_block;
    (__return_storage_ptr__->m_put).m_next_ptr = local_40.m_put.m_next_ptr;
    __return_storage_ptr__->m_queue = local_40.m_queue;
    local_40.m_put.m_user_storage = (void *)0x0;
    density::
    sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<void>::~reentrant_put_transaction
              ((reentrant_put_transaction<void> *)&local_40);
    return __return_storage_ptr__;
  default:
    assert_failed<>("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                    ,0x109);
  case 0:
    density::
    sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
    ::try_start_reentrant_push<float&>
              (&local_40,
               (sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                *)queue,i_progress_guarantee,&source);
  }
  (__return_storage_ptr__->m_put).m_user_storage = local_40.m_put.m_user_storage;
  (__return_storage_ptr__->m_put).m_control_block = local_40.m_put.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_40.m_put.m_next_ptr;
  __return_storage_ptr__->m_queue = local_40.m_queue;
  local_40.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<float>::~reentrant_put_transaction(&local_40);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & queue, EasyRandom & i_rand)
            {
                auto       source             = s_value;
                auto const progress_guarantee = get_rand_progress_guarantee(i_rand);
                switch (i_rand.get_int(3))
                {
                default:
                    DENSITY_TEST_ASSERT(false);
                case 0:
                    return queue.try_start_reentrant_push(progress_guarantee, source);
                case 1:
                    return queue.template try_start_reentrant_emplace<float>(
                      progress_guarantee, source);
                case 2:
                    return queue.try_start_reentrant_dyn_push_copy(
                      progress_guarantee, QUEUE::runtime_type::template make<float>(), &source);
                case 3:
                    return queue.try_start_reentrant_dyn_push_move(
                      progress_guarantee, QUEUE::runtime_type::template make<float>(), &source);

                    /*case 2:
                {
                    auto put = queue.template try_start_reentrant_dyn_push(progress_guarantee,
                        QUEUE::runtime_type::template make<float>());
                    if (put)
                    {
                        *static_cast<float*>(put.element_ptr()) += source;
                    }
                    return static_cast<bool>(put);
                }*/
                }
            }